

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall icu_63::double_conversion::Bignum::AssignUInt16(Bignum *this,uint16_t value)

{
  undefined2 in_register_00000032;
  
  Zero(this);
  if (CONCAT22(in_register_00000032,value) != 0) {
    *(this->bigits_).start_ = (uint)value;
    this->used_digits_ = 1;
  }
  return;
}

Assistant:

void Bignum::AssignUInt16(uint16_t value) {
  ASSERT(kBigitSize >= BitSize(value));
  Zero();
  if (value == 0) return;

  EnsureCapacity(1);
  bigits_[0] = value;
  used_digits_ = 1;
}